

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
          (SmallVectorBase<slang::syntax::TokenOrSyntax> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_type sVar1;
  undefined8 uVar2;
  byte *pbVar3;
  byte *pbVar4;
  pointer pTVar5;
  byte *pbVar6;
  pointer pTVar7;
  byte *pbVar8;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar6 = pbVar3 + sVar1 * 0x18;
  if (*(byte **)(dst + 8) < pbVar6) {
    pbVar4 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x18,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_001886b0;
    pTVar5 = this->data_;
    pTVar7 = pTVar5 + sVar1;
    pbVar6 = pbVar4 + sVar1 * 0x18;
    pbVar3 = pbVar4;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar6;
    pTVar5 = this->data_;
    pTVar7 = pTVar5 + sVar1;
    pbVar4 = pbVar3;
  }
  do {
    pbVar8 = pbVar3 + 0x18;
    *(undefined8 *)(pbVar3 + 0x10) =
         *(undefined8 *)
          ((long)&(pTVar5->super_ConstTokenOrSyntax).
                  super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                  super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                  super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  .
                  super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  .super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
          + 0x10);
    uVar2 = *(undefined8 *)
             ((long)&(pTVar5->super_ConstTokenOrSyntax).
                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                     .
                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                     .
                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
             + 8);
    *(undefined8 *)pbVar3 =
         *(undefined8 *)
          &(pTVar5->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>;
    *(undefined8 *)(pbVar3 + 8) = uVar2;
    if (pTVar5 + 1 == pTVar7) break;
    pTVar5 = pTVar5 + 1;
    pbVar3 = pbVar8;
  } while (pbVar8 != pbVar6);
LAB_001886b0:
  return (int)pbVar4;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }